

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  U32 UVar16;
  int *piVar17;
  BYTE *pBVar18;
  uint uVar19;
  ulong uVar20;
  U32 UVar21;
  U32 UVar22;
  ulong uVar23;
  size_t offbaseFound;
  BYTE *litLimit_w;
  size_t local_88;
  int *local_80;
  BYTE *local_78;
  int *local_70;
  uint local_68;
  uint local_64;
  BYTE *local_60;
  int *local_58;
  U32 *local_50;
  BYTE *local_48;
  ulong local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_70 = (int *)((long)src + (srcSize - 8));
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_78 = pBVar3 + uVar2;
  uVar8 = (ms->cParams).minMatch;
  uVar19 = 6;
  if (uVar8 < 6) {
    uVar19 = uVar8;
  }
  local_68 = 4;
  if (4 < uVar19) {
    local_68 = uVar19;
  }
  pZVar4 = ms->dictMatchState;
  local_60 = (pZVar4->window).nextSrc;
  local_38 = (pZVar4->window).base;
  local_48 = local_38 + (pZVar4->window).dictLimit;
  UVar22 = *rep;
  piVar15 = (int *)((ulong)(((int)src - ((int)local_48 + (int)local_78)) + (int)local_60 == 0) +
                   (long)src);
  UVar16 = rep[1];
  ms->lazySkipping = 0;
  local_50 = rep;
  if (piVar15 < local_70) {
    local_64 = ((int)local_38 - (int)local_60) + uVar2;
    pBVar18 = local_38 + -(ulong)local_64;
    local_58 = (int *)(iEnd + -0x20);
    do {
      piVar14 = (int *)((long)piVar15 + 1);
      uVar8 = (((int)piVar15 - (int)pBVar3) - UVar22) + 1;
      piVar17 = (int *)(pBVar3 + uVar8);
      if (uVar8 < uVar2) {
        piVar17 = (int *)(local_38 + (uVar8 - local_64));
      }
      bVar7 = true;
      if ((uVar8 - uVar2 < 0xfffffffd) && (*piVar17 == *piVar14)) {
        pBVar11 = iEnd;
        if (uVar8 < uVar2) {
          pBVar11 = local_60;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar15 + 5),(BYTE *)(piVar17 + 1),iEnd,pBVar11,local_78);
        uVar23 = sVar9 + 4;
        bVar7 = false;
      }
      else {
        uVar23 = 0;
      }
      uVar20 = 1;
      UVar21 = UVar22;
      if (bVar7) {
        local_88 = 999999999;
        local_80 = (int *)src;
        if (local_68 == 6) {
          uVar10 = ZSTD_HcFindBestMatch_dictMatchState_6(ms,(BYTE *)piVar15,iEnd,&local_88);
        }
        else if (local_68 == 5) {
          uVar10 = ZSTD_HcFindBestMatch_dictMatchState_5(ms,(BYTE *)piVar15,iEnd,&local_88);
        }
        else {
          uVar10 = ZSTD_HcFindBestMatch_dictMatchState_4(ms,(BYTE *)piVar15,iEnd,&local_88);
        }
        uVar20 = local_88;
        piVar17 = piVar15;
        if (uVar10 <= uVar23) {
          uVar10 = uVar23;
          uVar20 = 1;
          piVar17 = piVar14;
        }
        piVar14 = piVar17;
        uVar23 = uVar10;
        src = local_80;
        if (3 < uVar23) {
          if (3 < uVar20) {
            uVar10 = (long)piVar14 + (-(long)pBVar3 - uVar20) + -0xfffffffd;
            pBVar12 = pBVar3;
            pBVar11 = local_78;
            if ((uint)uVar10 < uVar2) {
              pBVar12 = pBVar18;
              pBVar11 = local_48;
            }
            if ((local_80 < piVar14) && (uVar10 = uVar10 & 0xffffffff, pBVar11 < pBVar12 + uVar10))
            {
              pBVar12 = pBVar12 + uVar10;
              do {
                piVar15 = (int *)((long)piVar14 + -1);
                pBVar12 = pBVar12 + -1;
                if ((*(BYTE *)piVar15 != *pBVar12) ||
                   (uVar23 = uVar23 + 1, piVar14 = piVar15, piVar15 <= local_80)) break;
              } while (pBVar11 < pBVar12);
            }
            UVar21 = (int)uVar20 - 3;
            UVar16 = UVar22;
          }
          goto LAB_01d65245;
        }
        uVar23 = (long)piVar15 - (long)local_80;
        piVar15 = (int *)((long)piVar15 + (uVar23 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar23);
        piVar14 = local_70;
      }
      else {
LAB_01d65245:
        uVar10 = (long)piVar14 - (long)src;
        if (local_58 < piVar14) {
          local_80 = piVar14;
          local_40 = uVar20;
          ZSTD_safecopyLiterals(seqStore->lit,(BYTE *)src,(BYTE *)piVar14,(BYTE *)local_58);
          piVar14 = local_80;
          uVar20 = local_40;
        }
        else {
          pBVar11 = seqStore->lit;
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar11 = *src;
          *(undefined8 *)(pBVar11 + 8) = uVar6;
          if (0x10 < uVar10) {
            pBVar11 = seqStore->lit;
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar11 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar11 + 0x18) = uVar6;
            if (0x20 < (long)uVar10) {
              lVar13 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar13 + 0x20);
                uVar6 = puVar1[1];
                pBVar12 = pBVar11 + lVar13 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar13 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar13 = lVar13 + 0x20;
              } while (pBVar12 + 0x20 < pBVar11 + uVar10);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar10;
        if (0xffff < uVar10) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5 = seqStore->sequences;
        psVar5->litLength = (U16)uVar10;
        psVar5->offBase = (U32)uVar20;
        if (0xffff < uVar23 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)(uVar23 - 3);
        seqStore->sequences = psVar5 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar15 = (int *)((long)piVar14 + uVar23);
        piVar14 = local_70;
        src = piVar15;
        do {
          UVar22 = UVar21;
          if (piVar14 < piVar15) break;
          uVar8 = ((int)piVar15 - (int)pBVar3) - UVar16;
          pBVar11 = pBVar3;
          if (uVar8 < uVar2) {
            pBVar11 = pBVar18;
          }
          if ((uVar8 - uVar2 < 0xfffffffd) && (*(int *)(pBVar11 + uVar8) == *piVar15)) {
            pBVar12 = iEnd;
            if (uVar8 < uVar2) {
              pBVar12 = local_60;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar15 + 1),(BYTE *)((long)(pBVar11 + uVar8) + 4),iEnd,
                               pBVar12,local_78);
            pBVar11 = seqStore->lit;
            if (local_58 < src) {
              ZSTD_safecopyLiterals(pBVar11,(BYTE *)src,(BYTE *)src,(BYTE *)local_58);
            }
            else {
              uVar6 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar11 = *src;
              *(undefined8 *)(pBVar11 + 8) = uVar6;
            }
            psVar5 = seqStore->sequences;
            psVar5->litLength = 0;
            psVar5->offBase = 1;
            if (0xffff < sVar9 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar5->mlBase = (U16)(sVar9 + 1);
            seqStore->sequences = psVar5 + 1;
            piVar15 = (int *)((long)piVar15 + sVar9 + 4);
            bVar7 = true;
            piVar14 = local_70;
            src = piVar15;
            UVar21 = UVar16;
          }
          else {
            bVar7 = false;
            UVar22 = UVar16;
          }
          UVar16 = UVar22;
          UVar22 = UVar21;
        } while (bVar7);
      }
    } while (piVar15 < piVar14);
  }
  *local_50 = UVar22;
  local_50[1] = UVar16;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}